

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::GetGlyphData(Font *font,int glyph_index,uint8_t **glyph_data,size_t *glyph_size)

{
  bool bVar1;
  Table *pTVar2;
  Table *pTVar3;
  Table *pTVar4;
  uint local_74;
  uint local_70;
  uint32_t offset2_1;
  uint32_t offset1_1;
  uint16_t offset2;
  uint16_t offset1;
  Buffer loca_buf;
  int index_fmt;
  Table *glyf_table;
  Table *loca_table;
  Table *head_table;
  size_t *glyph_size_local;
  uint8_t **glyph_data_local;
  int glyph_index_local;
  Font *font_local;
  
  if (glyph_index < 0) {
    font_local._7_1_ = false;
  }
  else {
    pTVar2 = Font::FindTable(font,0x68656164);
    pTVar3 = Font::FindTable(font,0x6c6f6361);
    pTVar4 = Font::FindTable(font,0x676c7966);
    if ((((pTVar2 == (Table *)0x0) || (pTVar3 == (Table *)0x0)) || (pTVar4 == (Table *)0x0)) ||
       (pTVar2->length < 0x34)) {
      font_local._7_1_ = false;
    }
    else {
      loca_buf.offset_._4_4_ = IndexFormat(font);
      Buffer::Buffer((Buffer *)&offset1_1,pTVar3->data,(ulong)pTVar3->length);
      if (loca_buf.offset_._4_4_ == 0) {
        bVar1 = Buffer::Skip((Buffer *)&offset1_1,(long)(glyph_index << 1));
        if ((((!bVar1) ||
             (bVar1 = Buffer::ReadU16((Buffer *)&offset1_1,(uint16_t *)((long)&offset2_1 + 2)),
             !bVar1)) ||
            (bVar1 = Buffer::ReadU16((Buffer *)&offset1_1,(uint16_t *)&offset2_1), !bVar1)) ||
           (((ushort)offset2_1 < offset2_1._2_2_ || (pTVar4->length < (uint)(ushort)offset2_1 << 1))
           )) {
          return false;
        }
        *glyph_data = pTVar4->data + (int)((uint)offset2_1._2_2_ << 1);
        *glyph_size = (long)(int)(((uint)(ushort)offset2_1 - (uint)offset2_1._2_2_) * 2);
      }
      else {
        bVar1 = Buffer::Skip((Buffer *)&offset1_1,(long)(glyph_index << 2));
        if (((!bVar1) || (bVar1 = Buffer::ReadU32((Buffer *)&offset1_1,&local_70), !bVar1)) ||
           ((bVar1 = Buffer::ReadU32((Buffer *)&offset1_1,&local_74), !bVar1 ||
            ((local_74 < local_70 || (pTVar4->length < local_74)))))) {
          return false;
        }
        *glyph_data = pTVar4->data + local_70;
        *glyph_size = (ulong)(local_74 - local_70);
      }
      font_local._7_1_ = true;
    }
  }
  return font_local._7_1_;
}

Assistant:

bool GetGlyphData(const Font& font, int glyph_index,
                  const uint8_t** glyph_data, size_t* glyph_size) {
  if (glyph_index < 0) {
    return FONT_COMPRESSION_FAILURE();
  }
  const Font::Table* head_table = font.FindTable(kHeadTableTag);
  const Font::Table* loca_table = font.FindTable(kLocaTableTag);
  const Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
  if (head_table == NULL || loca_table == NULL || glyf_table == NULL ||
      head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  int index_fmt = IndexFormat(font);

  Buffer loca_buf(loca_table->data, loca_table->length);
  if (index_fmt == 0) {
    uint16_t offset1, offset2;
    if (!loca_buf.Skip(2 * glyph_index) ||
        !loca_buf.ReadU16(&offset1) ||
        !loca_buf.ReadU16(&offset2) ||
        offset2 < offset1 ||
        2 * offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + 2 * offset1;
    *glyph_size = 2 * (offset2 - offset1);
  } else {
    uint32_t offset1, offset2;
    if (!loca_buf.Skip(4 * glyph_index) ||
        !loca_buf.ReadU32(&offset1) ||
        !loca_buf.ReadU32(&offset2) ||
        offset2 < offset1 ||
        offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + offset1;
    *glyph_size = offset2 - offset1;
  }
  return true;
}